

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbtTriangleInfoMap.h
# Opt level: O2

void __thiscall cbtTriangleInfoMap::cbtTriangleInfoMap(cbtTriangleInfoMap *this)

{
  cbtHashMap<cbtHashInt,_cbtTriangleInfo>::cbtHashMap(&this->super_cbtInternalTriangleInfoMap);
  this->_vptr_cbtTriangleInfoMap = (_func_int **)&PTR__cbtTriangleInfoMap_011942c8;
  this->m_convexEpsilon = 0.0;
  this->m_planarEpsilon = 0.0001;
  this->m_equalVertexThreshold = 9.999999e-09;
  this->m_edgeDistanceThreshold = 0.1;
  this->m_maxEdgeAngleThreshold = 6.2831855;
  this->m_zeroAreaThreshold = 9.999999e-09;
  return;
}

Assistant:

cbtTriangleInfoMap()
	{
		m_convexEpsilon = 0.00f;
		m_planarEpsilon = 0.0001f;
		m_equalVertexThreshold = cbtScalar(0.0001) * cbtScalar(0.0001);
		m_edgeDistanceThreshold = cbtScalar(0.1);
		m_zeroAreaThreshold = cbtScalar(0.0001) * cbtScalar(0.0001);
		m_maxEdgeAngleThreshold = SIMD_2_PI;
	}